

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::LargeHeapBucket::ConstructFreelist(LargeHeapBucket *this,LargeHeapBlock *heapBlock)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Recycler *pRVar4;
  undefined8 *in_FS_OFFSET;
  
  if (heapBlock->hasPartialFreeObjects == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2f1,"(!heapBlock->hasPartialFreeObjects)",
                       "!heapBlock->hasPartialFreeObjects");
    if (!bVar3) goto LAB_0024ebd4;
    *puVar1 = 0;
  }
  if (heapBlock->isInPendingDisposeList == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x2f2,"(!heapBlock->IsInPendingDisposeList())",
                       "!heapBlock->IsInPendingDisposeList()");
    if (!bVar3) {
LAB_0024ebd4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if ((heapBlock->freeList).entries != (LargeHeapBlockFreeListEntry *)0x0) {
    RegisterFreeList(this,&heapBlock->freeList);
    pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    if (pRVar4->recyclerFlagsTable->Verbose == true) {
      pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
      bVar3 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,MemoryAllocationPhase);
      if (!bVar3) {
        pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
        bVar3 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase)
        ;
        if (!bVar3) goto LAB_0024ebbf;
      }
      Output::Print(L"Free list created for 0x%x bucket\n",(ulong)(this->super_HeapBucket).sizeCat);
    }
  }
LAB_0024ebbf:
  ReinsertLargeHeapBlock(this,heapBlock);
  return;
}

Assistant:

void
LargeHeapBucket::ConstructFreelist(LargeHeapBlock * heapBlock)
{
    Assert(!heapBlock->hasPartialFreeObjects);
    Assert(!heapBlock->IsInPendingDisposeList());

    // The free list is the only way we reuse heap block entries
    // so if the heap block is allocated from directly, it'll not
    // invalidate the free list
    LargeHeapBlockFreeList* freeList = heapBlock->GetFreeList();
    Assert(freeList);

    if (freeList->entries)
    {
        this->RegisterFreeList(freeList);

#if DBG
        LargeAllocationVerboseTrace(this->GetRecycler()->GetRecyclerFlagsTable(), _u("Free list created for 0x%x bucket\n"), this->sizeCat);
#endif
    }

    ReinsertLargeHeapBlock(heapBlock);
}